

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void cs_hmac_sha1(uchar *key,size_t keylen,uchar *data,size_t datalen,uchar *out)

{
  long lVar1;
  uchar tmp_key [20];
  uchar buf2 [64];
  uchar buf1 [64];
  cs_sha1_ctx local_98;
  
  if (0x40 < keylen) {
    local_98.state[0] = 0x67452301;
    local_98.state[1] = 0xefcdab89;
    local_98.state[2] = 0x98badcfe;
    local_98.state[3] = 0x10325476;
    local_98.state[4] = 0xc3d2e1f0;
    local_98.count[0] = 0;
    local_98.count[1] = 0;
    cs_sha1_update(&local_98,key,(uint32_t)keylen);
    cs_sha1_final(tmp_key,&local_98);
    keylen = 0x14;
    key = tmp_key;
  }
  buf1[0x30] = '\0';
  buf1[0x31] = '\0';
  buf1[0x32] = '\0';
  buf1[0x33] = '\0';
  buf1[0x34] = '\0';
  buf1[0x35] = '\0';
  buf1[0x36] = '\0';
  buf1[0x37] = '\0';
  buf1[0x38] = '\0';
  buf1[0x39] = '\0';
  buf1[0x3a] = '\0';
  buf1[0x3b] = '\0';
  buf1[0x3c] = '\0';
  buf1[0x3d] = '\0';
  buf1[0x3e] = '\0';
  buf1[0x3f] = '\0';
  buf1[0x20] = '\0';
  buf1[0x21] = '\0';
  buf1[0x22] = '\0';
  buf1[0x23] = '\0';
  buf1[0x24] = '\0';
  buf1[0x25] = '\0';
  buf1[0x26] = '\0';
  buf1[0x27] = '\0';
  buf1[0x28] = '\0';
  buf1[0x29] = '\0';
  buf1[0x2a] = '\0';
  buf1[0x2b] = '\0';
  buf1[0x2c] = '\0';
  buf1[0x2d] = '\0';
  buf1[0x2e] = '\0';
  buf1[0x2f] = '\0';
  buf1[0x10] = '\0';
  buf1[0x11] = '\0';
  buf1[0x12] = '\0';
  buf1[0x13] = '\0';
  buf1[0x14] = '\0';
  buf1[0x15] = '\0';
  buf1[0x16] = '\0';
  buf1[0x17] = '\0';
  buf1[0x18] = '\0';
  buf1[0x19] = '\0';
  buf1[0x1a] = '\0';
  buf1[0x1b] = '\0';
  buf1[0x1c] = '\0';
  buf1[0x1d] = '\0';
  buf1[0x1e] = '\0';
  buf1[0x1f] = '\0';
  buf1[0] = '\0';
  buf1[1] = '\0';
  buf1[2] = '\0';
  buf1[3] = '\0';
  buf1[4] = '\0';
  buf1[5] = '\0';
  buf1[6] = '\0';
  buf1[7] = '\0';
  buf1[8] = '\0';
  buf1[9] = '\0';
  buf1[10] = '\0';
  buf1[0xb] = '\0';
  buf1[0xc] = '\0';
  buf1[0xd] = '\0';
  buf1[0xe] = '\0';
  buf1[0xf] = '\0';
  buf2[0] = '\0';
  buf2[1] = '\0';
  buf2[2] = '\0';
  buf2[3] = '\0';
  buf2[4] = '\0';
  buf2[5] = '\0';
  buf2[6] = '\0';
  buf2[7] = '\0';
  buf2[8] = '\0';
  buf2[9] = '\0';
  buf2[10] = '\0';
  buf2[0xb] = '\0';
  buf2[0xc] = '\0';
  buf2[0xd] = '\0';
  buf2[0xe] = '\0';
  buf2[0xf] = '\0';
  buf2[0x10] = '\0';
  buf2[0x11] = '\0';
  buf2[0x12] = '\0';
  buf2[0x13] = '\0';
  buf2[0x14] = '\0';
  buf2[0x15] = '\0';
  buf2[0x16] = '\0';
  buf2[0x17] = '\0';
  buf2[0x18] = '\0';
  buf2[0x19] = '\0';
  buf2[0x1a] = '\0';
  buf2[0x1b] = '\0';
  buf2[0x1c] = '\0';
  buf2[0x1d] = '\0';
  buf2[0x1e] = '\0';
  buf2[0x1f] = '\0';
  buf2[0x20] = '\0';
  buf2[0x21] = '\0';
  buf2[0x22] = '\0';
  buf2[0x23] = '\0';
  buf2[0x24] = '\0';
  buf2[0x25] = '\0';
  buf2[0x26] = '\0';
  buf2[0x27] = '\0';
  buf2[0x28] = '\0';
  buf2[0x29] = '\0';
  buf2[0x2a] = '\0';
  buf2[0x2b] = '\0';
  buf2[0x2c] = '\0';
  buf2[0x2d] = '\0';
  buf2[0x2e] = '\0';
  buf2[0x2f] = '\0';
  buf2[0x30] = '\0';
  buf2[0x31] = '\0';
  buf2[0x32] = '\0';
  buf2[0x33] = '\0';
  buf2[0x34] = '\0';
  buf2[0x35] = '\0';
  buf2[0x36] = '\0';
  buf2[0x37] = '\0';
  buf2[0x38] = '\0';
  buf2[0x39] = '\0';
  buf2[0x3a] = '\0';
  buf2[0x3b] = '\0';
  buf2[0x3c] = '\0';
  buf2[0x3d] = '\0';
  buf2[0x3e] = '\0';
  buf2[0x3f] = '\0';
  memcpy(buf1,key,keylen);
  memcpy(buf2,key,keylen);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    buf1[lVar1] = buf1[lVar1] ^ 0x36;
    buf2[lVar1] = buf2[lVar1] ^ 0x5c;
  }
  local_98.state[0] = 0x67452301;
  local_98.state[1] = 0xefcdab89;
  local_98.state[2] = 0x98badcfe;
  local_98.state[3] = 0x10325476;
  local_98.state[4] = 0xc3d2e1f0;
  local_98.count[0] = 0;
  local_98.count[1] = 0;
  cs_sha1_update(&local_98,buf1,0x40);
  cs_sha1_update(&local_98,data,(uint32_t)datalen);
  cs_sha1_final(out,&local_98);
  local_98.state[0] = 0x67452301;
  local_98.state[1] = 0xefcdab89;
  local_98.state[2] = 0x98badcfe;
  local_98.state[3] = 0x10325476;
  local_98.state[4] = 0xc3d2e1f0;
  local_98.count[0] = 0;
  local_98.count[1] = 0;
  cs_sha1_update(&local_98,buf2,0x40);
  cs_sha1_update(&local_98,out,0x14);
  cs_sha1_final(out,&local_98);
  return;
}

Assistant:

void cs_hmac_sha1(const unsigned char *key, size_t keylen,
                  const unsigned char *data, size_t datalen,
                  unsigned char out[20]) {
    cs_sha1_ctx ctx;
    unsigned char buf1[64], buf2[64], tmp_key[20], i;

    if (keylen > sizeof(buf1)) {
        cs_sha1_init(&ctx);
        cs_sha1_update(&ctx, key, keylen);
        cs_sha1_final(tmp_key, &ctx);
        key = tmp_key;
        keylen = sizeof(tmp_key);
    }

    memset(buf1, 0, sizeof(buf1));
    memset(buf2, 0, sizeof(buf2));
    memcpy(buf1, key, keylen);
    memcpy(buf2, key, keylen);

    for (i = 0; i < sizeof(buf1); i++) {
        buf1[i] ^= 0x36;
        buf2[i] ^= 0x5c;
    }

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf1, sizeof(buf1));
    cs_sha1_update(&ctx, data, datalen);
    cs_sha1_final(out, &ctx);

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf2, sizeof(buf2));
    cs_sha1_update(&ctx, out, 20);
    cs_sha1_final(out, &ctx);
}